

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_longest_match64_inc.h
# Opt level: O2

void PrepareH6(HasherHandle handle,int one_shot,size_t input_size,uint8_t *data)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  
  if (*(ulong *)(handle + 0x28) >> 6 < input_size || one_shot == 0) {
    memset(handle + 0x50,0,*(ulong *)(handle + 0x28) * 2);
    return;
  }
  for (sVar4 = 0; input_size != sVar4; sVar4 = sVar4 + 1) {
    bVar1 = handle[0x38];
    uVar2 = *(ulong *)(data + sVar4);
    uVar3 = *(ulong *)(handle + 0x40);
    (handle + ((uVar2 & uVar3) * 0x1fe35a7bd3579bd3 >> (bVar1 & 0x3f) & 0xffffffff) * 2 + 0x50)[0] =
         '\0';
    (handle + ((uVar2 & uVar3) * 0x1fe35a7bd3579bd3 >> (bVar1 & 0x3f) & 0xffffffff) * 2 + 0x50)[1] =
         '\0';
  }
  return;
}

Assistant:

static void FN(Prepare)(HasherHandle handle, BROTLI_BOOL one_shot,
    size_t input_size, const uint8_t* data) {
  HashLongestMatch* self = FN(Self)(handle);
  uint16_t* num = FN(Num)(self);
  /* Partial preparation is 100 times slower (per socket). */
  size_t partial_prepare_threshold = self->bucket_size_ >> 6;
  if (one_shot && input_size <= partial_prepare_threshold) {
    size_t i;
    for (i = 0; i < input_size; ++i) {
      const uint32_t key = FN(HashBytes)(&data[i], self->hash_mask_,
                                         self->hash_shift_);
      num[key] = 0;
    }
  } else {
    memset(num, 0, self->bucket_size_ * sizeof(num[0]));
  }
}